

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::less_optimized::~less_optimized(less_optimized *this)

{
  less_optimized *this_local;
  
  ~less_optimized(this);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      TEST_EQ("#f", run_optimized("(< 4 2)"));
      TEST_EQ("#t", run_optimized("(< 2 4)"));
      TEST_EQ("#f", run_optimized("(< 4 2 3)"));
      TEST_EQ("#t", run_optimized("(< 2 4 5)"));
      TEST_EQ("#f", run_optimized("(< 2 4 3)"));

      TEST_EQ("#f", run_optimized("(< 4.1 2)"));
      TEST_EQ("#t", run_optimized("(< 2.1 4)"));
      TEST_EQ("#f", run_optimized("(< 4.1 2 3)"));
      TEST_EQ("#t", run_optimized("(< 2.1 4 5)"));
      TEST_EQ("#f", run_optimized("(< 2.1 4 3)"));

      TEST_EQ("#t", run_optimized("(< 12 13)"));
      TEST_EQ("#f", run_optimized("(< 12 12)"));
      TEST_EQ("#f", run_optimized("(< 13 12)"));
      TEST_EQ("#f", run_optimized("(< 16 (+ 13 1)) "));
      TEST_EQ("#f", run_optimized("(< 16 (+ 13 3))"));
      TEST_EQ("#t", run_optimized("(< 16 (+ 13 13))"));
      TEST_EQ("#t", run_optimized("(< (+ 13 1) 16) "));
      TEST_EQ("#f", run_optimized("(< (+ 13 3) 16) "));
      TEST_EQ("#f", run_optimized("(< (+ 13 13) 16)"));

      TEST_EQ("#t", run_optimized("(< 12.0 13)"));
      TEST_EQ("#f", run_optimized("(< 12.0 12)"));
      TEST_EQ("#f", run_optimized("(< 13.0 12)"));
      TEST_EQ("#f", run_optimized("(< 16.0 (+ 13 1.0)) "));
      TEST_EQ("#f", run_optimized("(< 16.0 (+ 13.0 3.0))"));
      TEST_EQ("#t", run_optimized("(< 16.0 (+ 13.0 13.0))"));
      TEST_EQ("#t", run_optimized("(< (+ 13.0 1) 16.0) "));
      TEST_EQ("#f", run_optimized("(< (+ 13.0 3.000000001) 16.0)"));
      TEST_EQ("#f", run_optimized("(< (+ 13 13.0) 16)"));
      }